

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall
QNetworkReplyHttpImplPrivate::sentUploadDataSlot
          (QNetworkReplyHttpImplPrivate *this,qint64 pos,qint64 amount)

{
  long lVar1;
  bool bVar2;
  element_type *peVar3;
  QString *in_RDX;
  long in_RSI;
  QNetworkReplyHttpImplPrivate *in_RDI;
  long in_FS_OFFSET;
  QNetworkReplyHttpImplPrivate *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&in_RDI->uploadByteDevice);
  if (bVar2) {
    if ((long)&(in_RDX->d).d + in_RDI->uploadByteDevicePosition == in_RSI) {
      peVar3 = std::
               __shared_ptr_access<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x31e8e4);
      (**(code **)(*(long *)peVar3 + 0x68))(peVar3,in_RDX);
      in_RDI->uploadByteDevicePosition = (long)&(in_RDX->d).d + in_RDI->uploadByteDevicePosition;
    }
    else {
      QString::QString((QString *)0x31e8b3);
      error(this_00,(NetworkError)((ulong)in_RSI >> 0x20),in_RDX);
      QString::~QString((QString *)0x31e8d1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QNetworkReplyHttpImplPrivate::sentUploadDataSlot(qint64 pos, qint64 amount)
{
    if (!uploadByteDevice) // uploadByteDevice is no longer available
        return;

    if (uploadByteDevicePosition + amount != pos) {
        // Sanity check, should not happen.
        error(QNetworkReply::UnknownNetworkError, QString());
        return;
    }
    uploadByteDevice->advanceReadPointer(amount);
    uploadByteDevicePosition += amount;
}